

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::reinsertEquation(HPresolve *this,HighsInt row)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar6;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  const_iterator in_stack_ffffffffffffff98;
  int *__args;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar7;
  _Self local_18;
  int local_c;
  
  local_c = in_ESI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)in_ESI);
  __args = (int *)*pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)local_c);
  uVar7 = false;
  if (((double)__args == *pvVar2) && (!NAN((double)__args) && !NAN(*pvVar2))) {
    in_stack_ffffffffffffff98._M_node =
         (_Base_ptr)
         std::
         vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
         ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                       *)(in_RDI + 0xae),(long)local_c);
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff98._M_node,&local_18);
    uVar7 = false;
    if (bVar1) {
      std::
      vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
      ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                    *)(in_RDI + 0xae),(long)local_c);
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x6fe3a7);
      in_stack_ffffffffffffff94 = ppVar3->first;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_c);
      uVar7 = in_stack_ffffffffffffff94 != *pvVar4;
    }
  }
  if ((bool)uVar7 != false) {
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
    ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                  *)(in_RDI + 0xae),(long)local_c);
    std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>::
    erase_abi_cxx11_((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff98);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_c);
    pVar6 = std::
            set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::emplace<int&,int&>
                      ((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        *)CONCAT17(uVar7,in_stack_ffffffffffffffb0),__args,(int *)in_RDI);
    pvVar5 = std::
             vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
             ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                           *)(in_RDI + 0xae),(long)local_c);
    pvVar5->_M_node = pVar6.first._M_node._M_node;
  }
  return;
}

Assistant:

void HPresolve::reinsertEquation(HighsInt row) {
  // check if this is an equation row and it now has a different size
  if (model->row_lower_[row] == model->row_upper_[row] &&
      eqiters[row] != equations.end() && eqiters[row]->first != rowsize[row]) {
    // if that is the case reinsert it into the equation set that is ordered
    // by sparsity
    equations.erase(eqiters[row]);
    eqiters[row] = equations.emplace(rowsize[row], row).first;
  }
}